

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

bool __thiscall slang::parsing::Token::isOnSameLine(Token *this)

{
  TriviaKind TVar1;
  pointer pTVar2;
  long lVar3;
  size_type sVar4;
  long lVar5;
  bool bVar6;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar7;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  sVar7 = trivia(this);
  pTVar2 = sVar7.data_;
  bVar6 = sVar7.size_ == 0;
  if (!bVar6) {
    lVar5 = 0;
    do {
      TVar1 = (&pTVar2->kind)[lVar5];
      if (TVar1 < (Directive|Whitespace)) {
        if (TVar1 == BlockComment) {
          if ((byte)((&pTVar2->kind)[lVar5] - SkippedTokens) < 3) {
            local_40._M_str = "";
            local_40._M_len = 0;
          }
          else {
            local_40._M_str = *(char **)((long)&pTVar2->field_0 + lVar5);
            if ((&pTVar2->hasFullLocation)[lVar5] == true) {
              local_40._M_len = *(size_t *)local_40._M_str;
              local_40._M_str = *(char **)((long)local_40._M_str + 8);
            }
            else {
              local_40._M_len = (size_t)*(uint *)((long)&pTVar2->field_0 + lVar5 + 8);
            }
          }
          sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                            (&local_40,"\r\n",0,2);
          if (sVar4 != 0xffffffffffffffff) {
            return bVar6;
          }
        }
        else if (TVar1 == 8) {
          if ((byte)(TVar1 - SkippedSyntax) < 2) {
            lVar3 = *(long *)((long)&pTVar2->field_0 + lVar5);
          }
          else {
            lVar3 = 0;
          }
          if (*(int *)(lVar3 + 8) != 0x114) {
            return bVar6;
          }
        }
        else if ((0xecU >> (TVar1 & 0x1f) & 1) != 0) {
          return bVar6;
        }
      }
      lVar5 = lVar5 + 0x10;
      bVar6 = sVar7.size_ << 4 == lVar5;
    } while (!bVar6);
  }
  return bVar6;
}

Assistant:

bool Token::isOnSameLine() const {
    for (auto& t : trivia()) {
        switch (t.kind) {
            case TriviaKind::LineComment:
            case TriviaKind::EndOfLine:
            case TriviaKind::SkippedSyntax:
            case TriviaKind::SkippedTokens:
            case TriviaKind::DisabledText:
                return false;
            case TriviaKind::Directive:
                if (t.syntax()->kind != SyntaxKind::MacroUsage)
                    return false;
                break;
            case TriviaKind::BlockComment:
                if (size_t offset = t.getRawText().find_first_of("\r\n");
                    offset != std::string_view::npos) {
                    return false;
                }
                break;
            default:
                break;
        }
    }
    return true;
}